

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O3

bool __thiscall
deqp::gles3::Performance::anon_unknown_1::
ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
runSample(ModifyAfterBasicCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          *this,int iteration,
         UploadSampleResult<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
         *sample)

{
  uint uVar1;
  RenderContext *pRVar2;
  int iVar3;
  int iVar4;
  deUint32 err;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 in_register_00000034;
  long lVar6;
  uint uVar7;
  int iVar8;
  long lVar5;
  
  pRVar2 = ((this->
            super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
            ).super_TestCase.m_context)->m_renderCtx;
  iVar3 = (*pRVar2->_vptr_RenderContext[3])(pRVar2,CONCAT44(in_register_00000034,iteration));
  uVar1 = sample->bufferSize;
  lVar6 = (long)(int)uVar1;
  iVar4 = (*((this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar5 = CONCAT44(extraout_var_00,iVar4);
  (**(code **)(lVar5 + 0x6c8))(1);
  (**(code **)(lVar5 + 0x40))
            (0x8892,(this->
                    super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                    ).m_bufferID);
  (**(code **)(lVar5 + 0x150))
            (0x8892,lVar6,
             (this->m_zeroData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start,this->m_bufferUsage);
  (**(code **)(lVar5 + 0x19f0))
            ((this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).m_dummyProgramPosLoc,4,0x1406,0,0,0);
  iVar4 = (*((this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_01,iVar4) + 0x538))(0,0,1);
  uVar7 = uVar1 + 0xf;
  if (-1 < lVar6) {
    uVar7 = uVar1;
  }
  iVar8 = ((int)uVar7 >> 4) + -1;
  (**(code **)(CONCAT44(extraout_var_01,iVar4) + 0x538))(0,iVar8,1);
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
  waitGLResults(&this->
                 super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
               );
  deYield();
  tcu::warmupCPU();
  deYield();
  iVar4 = (*((this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_02,iVar4) + 0x538))(0,0,1);
  (**(code **)(CONCAT44(extraout_var_02,iVar4) + 0x538))(0,iVar8,1);
  (*(this->
    super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>)
    .super_TestCase.super_TestCase.super_TestNode._vptr_TestNode[7])(this,sample,(ulong)uVar1);
  if (this->m_bufferUnspecifiedAfterTest == true) {
    (**(code **)(lVar5 + 0x150))
              (0x8892,lVar6,
               (this->m_zeroData).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,this->m_bufferUsage);
  }
  iVar4 = (*((this->
             super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
             ).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3])();
  (**(code **)(CONCAT44(extraout_var_03,iVar4) + 0x538))(0,0,1);
  (**(code **)(CONCAT44(extraout_var_03,iVar4) + 0x538))(0,iVar8,1);
  BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>::
  waitGLResults(&this->
                 super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
               );
  (**(code **)(lVar5 + 0x438))
            (1,&(this->
                super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                ).m_bufferID);
  (this->
  super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>).
  m_bufferID = 0;
  err = (**(code **)(CONCAT44(extraout_var,iVar3) + 0x800))();
  glu::checkError(err,"Buffer upload sample",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pBufferDataUploadTests.cpp"
                  ,0xccb);
  return true;
}

Assistant:

bool ModifyAfterBasicCase<SampleType>::runSample (int iteration, UploadSampleResult<SampleType>& sample)
{
	const glw::Functions&	gl					= m_context.getRenderContext().getFunctions();
	const int				bufferSize			= sample.bufferSize;
	bool					testOk;

	testOk = prepareAndRunTest(iteration, sample, bufferSize);
	GLU_EXPECT_NO_ERROR(gl.getError(), "Buffer upload sample");

	if (!testOk)
	{
		const int unmapFailureThreshold = 4;

		// only unmapping error can cause iteration failure
		if (++m_unmappingErrors >= unmapFailureThreshold)
			throw tcu::TestError("Too many unmapping errors, cannot continue.");

		// just try again
		return false;
	}

	return true;
}